

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON_bool parse_string(cJSON *item,parse_buffer *input_buffer)

{
  uchar *puVar1;
  size_t sVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  cJSON_bool cVar6;
  byte *pbVar7;
  long lVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  byte *pbVar12;
  byte *pbVar13;
  byte *pbVar14;
  long lVar15;
  
  puVar1 = input_buffer->content;
  sVar2 = input_buffer->offset;
  pbVar13 = puVar1 + sVar2 + 1;
  if ((puVar1[sVar2] == '\"') &&
     (pbVar7 = (byte *)input_buffer->length, pbVar13 + -(long)puVar1 < pbVar7)) {
    lVar15 = 1;
    lVar8 = 0;
    pbVar14 = pbVar13;
    do {
      if (puVar1[lVar15 + sVar2] == '\\') {
        if (pbVar7 <= (byte *)(lVar15 + sVar2 + 1)) break;
        lVar15 = lVar15 + 1;
        lVar8 = lVar8 + 1;
      }
      else if (puVar1[lVar15 + sVar2] == '\"') {
        pbVar7 = (byte *)(*(input_buffer->hooks).allocate)
                                   ((size_t)(pbVar14 + (1 - (long)(puVar1 + lVar8 + sVar2))));
        if (pbVar7 != (byte *)0x0) {
          pbVar12 = pbVar7;
          if (lVar15 < 2) goto LAB_00104dbf;
          goto LAB_00104ba9;
        }
        break;
      }
      pbVar14 = puVar1 + lVar15 + sVar2 + 1;
      lVar15 = lVar15 + 1;
    } while (pbVar14 + -(long)puVar1 < pbVar7);
  }
LAB_00104b58:
  pbVar14 = pbVar13 + -(long)input_buffer->content;
  cVar6 = 0;
  goto LAB_00104b5d;
LAB_00104ba9:
  do {
    bVar9 = *pbVar13;
    if (bVar9 == 0x5c) {
      if ((long)pbVar14 - (long)pbVar13 < 1) goto switchD_00104c12_caseD_6f;
      bVar9 = pbVar13[1];
      if (bVar9 < 0x62) {
        if (((bVar9 != 0x22) && (bVar9 != 0x2f)) && (bVar9 != 0x5c)) goto switchD_00104c12_caseD_6f;
        *pbVar12 = bVar9;
        goto LAB_00104be3;
      }
      switch(bVar9) {
      case 0x6e:
        *pbVar12 = 10;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
switchD_00104c12_caseD_6f:
        (*(input_buffer->hooks).deallocate)(pbVar7);
        goto LAB_00104b58;
      case 0x72:
        *pbVar12 = 0xd;
        break;
      case 0x74:
        *pbVar12 = 9;
        break;
      case 0x75:
        if ((ulong)((long)pbVar14 - (long)pbVar13) < 6) goto switchD_00104c12_caseD_6f;
        uVar4 = parse_hex4(pbVar13 + 2);
        uVar10 = (ulong)uVar4;
        if ((uVar4 & 0xfffffc00) == 0xd800) {
          if (((5 < (long)pbVar14 - (long)(pbVar13 + 6)) && (pbVar13[6] == 0x5c)) &&
             ((pbVar13[7] == 0x75 && (uVar5 = parse_hex4(pbVar13 + 8), 0xfffffbff < uVar5 - 0xe000))
             )) {
            uVar10 = (ulong)((uVar4 & 0x3ff) * 0x400 + (uVar5 & 0x3ff) + 0x10000);
            bVar9 = 0xf0;
            uVar4 = 4;
            lVar8 = 0xc;
LAB_00104d3b:
            uVar3 = (ulong)(uVar4 - 1 & 0xff);
            do {
              uVar11 = uVar3 - 1;
              pbVar12[uVar3] = (byte)uVar10 & 0x3f | 0x80;
              uVar10 = uVar10 >> 6;
              uVar3 = uVar11;
            } while ((char)uVar11 != '\0');
            bVar9 = (byte)uVar10 | bVar9;
            uVar10 = (ulong)uVar4;
            goto LAB_00104d89;
          }
          goto switchD_00104c12_caseD_6f;
        }
        if ((uVar4 & 0xfffffc00) == 0xdc00) goto switchD_00104c12_caseD_6f;
        if (0x7f < uVar4) {
          lVar8 = 6;
          if (uVar4 < 0x800) {
            bVar9 = 0xc0;
            uVar4 = 2;
          }
          else if (uVar4 < 0x10000) {
            bVar9 = 0xe0;
            uVar4 = 3;
          }
          else {
            if (0x10ffff < uVar4) goto switchD_00104c12_caseD_6f;
            bVar9 = 0xf0;
            uVar4 = 4;
          }
          goto LAB_00104d3b;
        }
        bVar9 = (byte)uVar4;
        uVar10 = 1;
        lVar8 = 6;
LAB_00104d89:
        *pbVar12 = bVar9;
        pbVar12 = pbVar12 + uVar10;
        goto LAB_00104beb;
      default:
        if (bVar9 == 0x66) {
          *pbVar12 = 0xc;
        }
        else {
          if (bVar9 != 0x62) goto switchD_00104c12_caseD_6f;
          *pbVar12 = 8;
        }
      }
LAB_00104be3:
      pbVar12 = pbVar12 + 1;
      lVar8 = 2;
LAB_00104beb:
      pbVar13 = pbVar13 + lVar8;
    }
    else {
      pbVar13 = pbVar13 + 1;
      *pbVar12 = bVar9;
      pbVar12 = pbVar12 + 1;
    }
  } while (pbVar13 < puVar1 + lVar15 + sVar2);
LAB_00104dbf:
  *pbVar12 = 0;
  item->type = 0x10;
  item->valuestring = (char *)pbVar7;
  pbVar14 = pbVar14 + (1 - (long)input_buffer->content);
  cVar6 = 1;
LAB_00104b5d:
  input_buffer->offset = (size_t)pbVar14;
  return cVar6;
}

Assistant:

static cJSON_bool parse_string(cJSON * const item, parse_buffer * const input_buffer)
{
    const unsigned char *input_pointer = buffer_at_offset(input_buffer) + 1;
    const unsigned char *input_end = buffer_at_offset(input_buffer) + 1;
    unsigned char *output_pointer = NULL;
    unsigned char *output = NULL;

    /* not a string */
    if (buffer_at_offset(input_buffer)[0] != '\"')
    {
        goto fail;
    }

    {
        /* calculate approximate size of the output (overestimate) */
        size_t allocation_length = 0;
        size_t skipped_bytes = 0;
        while (((size_t)(input_end - input_buffer->content) < input_buffer->length) && (*input_end != '\"'))
        {
            /* is escape sequence */
            if (input_end[0] == '\\')
            {
                if ((size_t)(input_end + 1 - input_buffer->content) >= input_buffer->length)
                {
                    /* prevent buffer overflow when last input character is a backslash */
                    goto fail;
                }
                skipped_bytes++;
                input_end++;
            }
            input_end++;
        }
        if (((size_t)(input_end - input_buffer->content) >= input_buffer->length) || (*input_end != '\"'))
        {
            goto fail; /* string ended unexpectedly */
        }

        /* This is at most how much we need for the output */
        allocation_length = (size_t) (input_end - buffer_at_offset(input_buffer)) - skipped_bytes;
        output = (unsigned char*)input_buffer->hooks.allocate(allocation_length + sizeof(""));
        if (output == NULL)
        {
            goto fail; /* allocation failure */
        }
    }

    output_pointer = output;
    /* loop through the string literal */
    while (input_pointer < input_end)
    {
        if (*input_pointer != '\\')
        {
            *output_pointer++ = *input_pointer++;
        }
        /* escape sequence */
        else
        {
            unsigned char sequence_length = 2;
            if ((input_end - input_pointer) < 1)
            {
                goto fail;
            }

            switch (input_pointer[1])
            {
                case 'b':
                    *output_pointer++ = '\b';
                    break;
                case 'f':
                    *output_pointer++ = '\f';
                    break;
                case 'n':
                    *output_pointer++ = '\n';
                    break;
                case 'r':
                    *output_pointer++ = '\r';
                    break;
                case 't':
                    *output_pointer++ = '\t';
                    break;
                case '\"':
                case '\\':
                case '/':
                    *output_pointer++ = input_pointer[1];
                    break;

                /* UTF-16 literal */
                case 'u':
                    sequence_length = utf16_literal_to_utf8(input_pointer, input_end, &output_pointer);
                    if (sequence_length == 0)
                    {
                        /* failed to convert UTF16-literal to UTF-8 */
                        goto fail;
                    }
                    break;

                default:
                    goto fail;
            }
            input_pointer += sequence_length;
        }
    }

    /* zero terminate the output */
    *output_pointer = '\0';

    item->type = cJSON_String;
    item->valuestring = (char*)output;

    input_buffer->offset = (size_t) (input_end - input_buffer->content);
    input_buffer->offset++;

    return true;

fail:
    if (output != NULL)
    {
        input_buffer->hooks.deallocate(output);
        output = NULL;
    }

    if (input_pointer != NULL)
    {
        input_buffer->offset = (size_t)(input_pointer - input_buffer->content);
    }

    return false;
}